

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::SplitBailOnNotArray
          (Lowerer *this,Instr *instr,Instr **bailOnNotArrayRef,Instr **bailOnMissingValueRef)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  BailOutInfo *bailOutInfo;
  Instr *pIVar6;
  BailOutInfo *pBVar7;
  BailOutInstrTemplate<IR::Instr> *this_00;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x337c,"(instr)","instr");
    if (!bVar2) goto LAB_005c382b;
    *puVar5 = 0;
  }
  if (instr->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x337d,"(!instr->GetDst())","!instr->GetDst()");
    if (!bVar2) goto LAB_005c382b;
    *puVar5 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x337e,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) goto LAB_005c382b;
    *puVar5 = 0;
  }
  OVar3 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x337f,"(instr->GetSrc1()->IsRegOpnd())","instr->GetSrc1()->IsRegOpnd()");
    if (!bVar2) goto LAB_005c382b;
    *puVar5 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3380,"(!instr->GetSrc2())","!instr->GetSrc2()");
    if (!bVar2) goto LAB_005c382b;
    *puVar5 = 0;
  }
  if (bailOnNotArrayRef == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3381,"(bailOnNotArrayRef)","bailOnNotArrayRef");
    if (!bVar2) goto LAB_005c382b;
    *puVar5 = 0;
  }
  if (bailOnMissingValueRef == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3382,"(bailOnMissingValueRef)","bailOnMissingValueRef");
    if (!bVar2) goto LAB_005c382b;
    *puVar5 = 0;
  }
  *bailOnNotArrayRef = instr;
  *bailOnMissingValueRef = (Instr *)0x0;
  BVar4 = IR::Instr::GetBailOutKind(instr);
  if (BVar4 - BailOutOnNotArray < 2) {
    return;
  }
  bailOutInfo = IR::Instr::GetBailOutInfo(instr);
  if (bailOutInfo->bailOutInstr == instr) {
    pIVar6 = IR::Instr::ShareBailOut(instr);
    pBVar7 = IR::Instr::GetBailOutInfo(pIVar6);
    if (pBVar7 != bailOutInfo) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3397,"(sharedBail->GetBailOutInfo() == bailOutInfo)",
                         "sharedBail->GetBailOutInfo() == bailOutInfo");
      if (!bVar2) goto LAB_005c382b;
      *puVar5 = 0;
    }
    LowerBailTarget(this,pIVar6);
  }
  if (1 < BVar4 - (BailOutOnMissingValue|BailOutOnNotArray)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x339c,
                       "(bailOutKind == IR::BailOutOnNotArray || bailOutKind == IR::BailOutOnNotNativeArray)"
                       ,
                       "bailOutKind == IR::BailOutOnNotArray || bailOutKind == IR::BailOutOnNotNativeArray"
                      );
    if (!bVar2) {
LAB_005c382b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  IR::Instr::SetBailOutKind(instr,BVar4 - BailOutOnMissingValue);
  pIVar6 = instr->m_next;
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotArray,BailOutOnMissingValue,bailOutInfo,bailOutInfo->bailOutFunc);
  *bailOnMissingValueRef = &this_00->super_Instr;
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,instr);
  IR::Instr::InsertBefore(pIVar6,*bailOnMissingValueRef);
  return;
}

Assistant:

void Lowerer::SplitBailOnNotArray(
    IR::Instr *const instr,
    IR::Instr * *const bailOnNotArrayRef,
    IR::Instr * *const bailOnMissingValueRef)
{
    Assert(instr);
    Assert(!instr->GetDst());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc1()->IsRegOpnd());
    Assert(!instr->GetSrc2());
    Assert(bailOnNotArrayRef);
    Assert(bailOnMissingValueRef);

    IR::Instr *&bailOnNotArray = *bailOnNotArrayRef;
    IR::Instr *&bailOnMissingValue = *bailOnMissingValueRef;

    bailOnNotArray = instr;
    bailOnMissingValue = nullptr;

    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    if(bailOutKind == IR::BailOutOnNotArray ||
       bailOutKind == IR::BailOutOnNotNativeArray)
    {
        return;
    }

    // Split array checks
    BailOutInfo *const bailOutInfo = instr->GetBailOutInfo();
    if(bailOutInfo->bailOutInstr == instr)
    {
        // Create a shared bailout point for the split bailout checks
        IR::Instr *const sharedBail = instr->ShareBailOut();
        Assert(sharedBail->GetBailOutInfo() == bailOutInfo);
        LowerBailTarget(sharedBail);
    }
    bailOutKind -= IR::BailOutOnMissingValue;
    Assert(bailOutKind == IR::BailOutOnNotArray ||
           bailOutKind == IR::BailOutOnNotNativeArray);
    instr->SetBailOutKind(bailOutKind);

    Func *const func = bailOutInfo->bailOutFunc;
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // Split missing value checks
    bailOnMissingValue = IR::BailOutInstr::New(Js::OpCode::BailOnNotArray, IR::BailOutOnMissingValue, bailOutInfo, func);
    bailOnMissingValue->SetByteCodeOffset(instr);
    insertBeforeInstr->InsertBefore(bailOnMissingValue);
}